

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O2

int SetHTTPrequest(Configurable *config,HttpReq req,HttpReq *store)

{
  if (*store == HTTPREQ_UNSPEC || *store == req) {
    *store = req;
    return 0;
  }
  warnf(config,"You can only select one HTTP request!\n");
  return 1;
}

Assistant:

int SetHTTPrequest(struct Configurable *config, HttpReq req, HttpReq *store)
{
  if((*store == HTTPREQ_UNSPEC) ||
     (*store == req)) {
    *store = req;
    return 0;
  }
  warnf(config, "You can only select one HTTP request!\n");
  return 1;
}